

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

VOID __thiscall
CorUnix::CThreadSuspensionInfo::ReleaseSuspensionLocks
          (CThreadSuspensionInfo *this,CPalThread *pthrSuspender,CPalThread *pthrTarget)

{
  CPalThread *pthrTarget_local;
  CPalThread *pthrSuspender_local;
  CThreadSuspensionInfo *this_local;
  
  CPalThread::ReleaseNativeWaitLock(pthrTarget);
  ReleaseSuspensionLock(this,pthrTarget);
  ReleaseSuspensionLock(this,pthrSuspender);
  return;
}

Assistant:

VOID
CThreadSuspensionInfo::ReleaseSuspensionLocks(
    CPalThread *pthrSuspender,
    CPalThread *pthrTarget
    )
{
    // See comment in AcquireSuspensionLocks
    pthrTarget->ReleaseNativeWaitLock();

#ifdef USE_GLOBAL_LOCK_FOR_SUSPENSION
    ReleaseSuspensionLock(pthrSuspender);
#else // USE_GLOBAL_LOCK_FOR_SUSPENSION
    ReleaseSuspensionLock(pthrTarget);
    ReleaseSuspensionLock(pthrSuspender);
#endif // USE_GLOBAL_LOCK_FOR_SUSPENSION
}